

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseFunction(Parser *this,string *name,Value *e)

{
  bool bVar1;
  char *__rhs;
  BaseType *in_RCX;
  CheckedError *ce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  double t;
  allocator<char> local_179;
  double x;
  string functionname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ParseDepthGuard depth_guard;
  
  ParseDepthGuard::ParseDepthGuard(&depth_guard,(Parser *)name);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eb44;
  CheckedError::~CheckedError((CheckedError *)this);
  std::__cxx11::string::string((string *)&functionname,(string *)&name[1]._M_string_length);
  if (*in_RCX - BASE_TYPE_FLOAT < 2) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      Expect(this,(int)name);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        ParseSingleValue(this,name,e,SUB81(in_RCX,0));
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          Expect(this,(int)name);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            anon_unknown_0::atot<double>
                      ((anon_unknown_0 *)this,*(char **)(in_RCX + 8),(Parser *)name,&x);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              bVar1 = std::operator==(&functionname,"deg");
              if (bVar1) {
                t = (x / 3.141592653589793) * 180.0;
              }
              else {
                bVar1 = std::operator==(&functionname,"rad");
                if (bVar1) {
                  t = (x * 3.141592653589793) / 180.0;
                }
                else {
                  bVar1 = std::operator==(&functionname,"sin");
                  if (bVar1) {
                    t = sin(x);
                  }
                  else {
                    bVar1 = std::operator==(&functionname,"cos");
                    if (bVar1) {
                      t = cos(x);
                    }
                    else {
                      bVar1 = std::operator==(&functionname,"tan");
                      if (bVar1) {
                        t = tan(x);
                      }
                      else {
                        bVar1 = std::operator==(&functionname,"asin");
                        if (bVar1) {
                          t = asin(x);
                        }
                        else {
                          bVar1 = std::operator==(&functionname,"acos");
                          if (bVar1) {
                            t = acos(x);
                          }
                          else {
                            bVar1 = std::operator==(&functionname,"atan");
                            if (!bVar1) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_f8,"Unknown conversion function: ",
                                         (allocator<char> *)&local_58);
                              std::operator+(&local_d8,&local_f8,&functionname);
                              std::operator+(&local_b8,&local_d8,", field name: ");
                              if (e == (Value *)0x0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_118,"",&local_179);
                              }
                              else {
                                std::__cxx11::string::string((string *)&local_118,(string *)e);
                              }
                              std::operator+(&local_98,&local_b8,&local_118);
                              std::operator+(&local_78,&local_98,", value: ");
                              std::operator+(&local_138,&local_78,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(in_RCX + 8));
                              Error(this,name);
                              std::__cxx11::string::~string((string *)&local_138);
                              std::__cxx11::string::~string((string *)&local_78);
                              std::__cxx11::string::~string((string *)&local_98);
                              std::__cxx11::string::~string((string *)&local_118);
                              std::__cxx11::string::~string((string *)&local_b8);
                              std::__cxx11::string::~string((string *)&local_d8);
                              this_00 = &local_f8;
                              goto LAB_0011eb35;
                            }
                            t = atan(x);
                          }
                        }
                      }
                    }
                  }
                }
              }
              NumToString<double>(&local_138,t);
              std::__cxx11::string::operator=((string *)(in_RCX + 8),(string *)&local_138);
              std::__cxx11::string::~string((string *)&local_138);
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x,
                   &functionname,": type of argument mismatch, expecting: ");
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x,"double")
    ;
    std::operator+(&local_f8,&local_118,", found: ");
    __rhs = TypeName(*in_RCX);
    std::operator+(&local_d8,&local_f8,__rhs);
    std::operator+(&local_b8,&local_d8,", name: ");
    if (e == (Value *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_179);
    }
    else {
      std::__cxx11::string::string((string *)&local_58,(string *)e);
    }
    std::operator+(&local_98,&local_b8,&local_58);
    std::operator+(&local_78,&local_98,", value: ");
    std::operator+(&local_138,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RCX + 8)
                  );
    Error(this,name);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x;
LAB_0011eb35:
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::string::~string((string *)&functionname);
LAB_0011eb44:
  (depth_guard.parser_)->parse_depth_counter_ = (depth_guard.parser_)->parse_depth_counter_ + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFunction(const std::string *name, Value &e) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  // Copy name, attribute will be changed on NEXT().
  const auto functionname = attribute_;
  if (!IsFloat(e.type.base_type)) {
    return Error(functionname + ": type of argument mismatch, expecting: " +
                 TypeName(BASE_TYPE_DOUBLE) +
                 ", found: " + TypeName(e.type.base_type) +
                 ", name: " + (name ? *name : "") + ", value: " + e.constant);
  }
  NEXT();
  EXPECT('(');
  ECHECK(ParseSingleValue(name, e, false));
  EXPECT(')');
  // calculate with double precision
  double x, y = 0.0;
  ECHECK(atot(e.constant.c_str(), *this, &x));
  // clang-format off
  auto func_match = false;
  #define FLATBUFFERS_FN_DOUBLE(name, op) \
    if (!func_match && functionname == name) { y = op; func_match = true; }
  FLATBUFFERS_FN_DOUBLE("deg", x / kPi * 180);
  FLATBUFFERS_FN_DOUBLE("rad", x * kPi / 180);
  FLATBUFFERS_FN_DOUBLE("sin", sin(x));
  FLATBUFFERS_FN_DOUBLE("cos", cos(x));
  FLATBUFFERS_FN_DOUBLE("tan", tan(x));
  FLATBUFFERS_FN_DOUBLE("asin", asin(x));
  FLATBUFFERS_FN_DOUBLE("acos", acos(x));
  FLATBUFFERS_FN_DOUBLE("atan", atan(x));
  // TODO(wvo): add more useful conversion functions here.
  #undef FLATBUFFERS_FN_DOUBLE
  // clang-format on
  if (true != func_match) {
    return Error(std::string("Unknown conversion function: ") + functionname +
                 ", field name: " + (name ? *name : "") +
                 ", value: " + e.constant);
  }
  e.constant = NumToString(y);
  return NoError();
}